

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_revsurface.cpp
# Opt level: O3

bool __thiscall ON_Surface::IsTorus(ON_Surface *this,ON_Torus *torus,double tolerance)

{
  double dVar1;
  ON_3dPoint P_00;
  ON_3dPoint P_01;
  ON_3dPoint test_point;
  ON_3dPoint test_point_00;
  ON_3dPoint test_point_01;
  ON_3dPoint test_point_02;
  ON_3dPoint test_point_03;
  ON_3dPoint test_point_04;
  bool bVar2;
  char cVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  void *memblock;
  long lVar10;
  ulong uVar11;
  ON_Plane *pOVar12;
  ON_Circle *pOVar13;
  ON_Torus *pOVar14;
  byte bVar15;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  double extraout_XMM1_Qa;
  double dVar16;
  ON_3dPoint P;
  ON_3dPoint T;
  ON_Torus tr1;
  ON_Torus tr0;
  ON_Arc arc1;
  ON_Arc arc0;
  ON_3dVector local_348;
  double local_330;
  double local_328;
  ON_3dPoint local_320;
  double local_308;
  ulong uStack_300;
  ON_3dVector local_2f8;
  undefined1 local_2d8 [16];
  double local_2c8;
  double local_2c0;
  uint local_2b4;
  void *local_2b0;
  ON_Torus *local_2a8;
  ulong local_2a0;
  double local_298;
  ulong local_290;
  ON_Torus local_288;
  ON_Torus local_1f8;
  ON_Circle local_160;
  double local_d8;
  double dStack_d0;
  ON_Circle local_c8;
  double local_40;
  double dStack_38;
  long *plVar9;
  
  bVar15 = 0;
  local_2d8._8_4_ = in_XMM0_Dc;
  local_2d8._0_8_ = tolerance;
  local_2d8._12_4_ = in_XMM0_Dd;
  bVar2 = ON_IsValid(tolerance);
  local_c8.plane.origin.y = (double)local_2d8._0_8_;
  uStack_300 = local_2d8._8_8_;
  if (!bVar2) {
    local_c8.plane.origin.y = 2.3283064365386963e-10;
    uStack_300 = 0;
  }
  local_308 = local_c8.plane.origin.y;
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,1);
  local_c8.plane.origin.x = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  dVar16 = ON_Interval::Mid((ON_Interval *)&local_c8);
  iVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])(SUB84(dVar16,0),this,0)
  ;
  plVar9 = (long *)CONCAT44(extraout_var,iVar6);
  if (plVar9 == (long *)0x0) {
    return false;
  }
  local_2d8._0_8_ =
       ~-(ulong)(0.0 < (double)local_2d8._0_8_) & 0x3df0000000000000 |
       (ulong)local_308 & -(ulong)(0.0 < (double)local_2d8._0_8_);
  pOVar12 = &ON_Plane::World_xy;
  pOVar13 = &local_c8;
  for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
    (pOVar13->plane).origin.x = (pOVar12->origin).x;
    pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar15 * -2 + 1) * 8);
    pOVar13 = (ON_Circle *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
  }
  local_c8.radius = 1.0;
  local_40 = ON_Interval::ZeroToTwoPi.m_t[0];
  dStack_38 = ON_Interval::ZeroToTwoPi.m_t[1];
  local_2d8._8_8_ = uStack_300 & local_2d8._8_8_;
  local_308 = (double)(-(ulong)(2.3283064365386963e-10 < (double)local_2d8._0_8_) & local_2d8._0_8_)
  ;
  uStack_300 = 0;
  local_2a8 = torus;
  cVar3 = (**(code **)(*plVar9 + 0x180))(plVar9,0);
  (**(code **)(*plVar9 + 0x20))(plVar9);
  if (cVar3 != '\0') {
    dVar16 = extraout_XMM1_Qa;
    (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(this,0);
    local_160.plane.origin.x = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
    local_160.plane.origin.y = dVar16;
    dVar16 = ON_Interval::Mid((ON_Interval *)&local_160);
    iVar6 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x38])
                      (SUB84(dVar16,0),this,1);
    plVar9 = (long *)CONCAT44(extraout_var_00,iVar6);
    if (plVar9 != (long *)0x0) {
      pOVar12 = &ON_Plane::World_xy;
      pOVar13 = &local_160;
      for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
        (pOVar13->plane).origin.x = (pOVar12->origin).x;
        pOVar12 = (ON_Plane *)((long)pOVar12 + ((ulong)bVar15 * -2 + 1) * 8);
        pOVar13 = (ON_Circle *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
      }
      local_160.radius = 1.0;
      local_d8 = ON_Interval::ZeroToTwoPi.m_t[0];
      dStack_d0 = ON_Interval::ZeroToTwoPi.m_t[1];
      cVar3 = (**(code **)(*plVar9 + 0x180))(local_308._0_4_,plVar9,0);
      (**(code **)(*plVar9 + 0x20))(plVar9);
      if (cVar3 == '\0') {
        bVar2 = false;
      }
      else {
        local_308 = local_c8.radius + local_160.radius;
        ON_Torus::ON_Torus(&local_1f8);
        pOVar13 = &local_c8;
        pOVar14 = &local_1f8;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pOVar14->plane).origin.x = (pOVar13->plane).origin.x;
          pOVar13 = (ON_Circle *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
          pOVar14 = (ON_Torus *)((long)pOVar14 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        P_00.y = local_160.plane.origin.y;
        P_00.x = local_160.plane.origin.x;
        P_00.z = local_160.plane.origin.z;
        dVar16 = ON_PlaneEquation::ValueAt(&local_1f8.plane.plane_equation,P_00);
        ::operator*(&local_348,dVar16,&local_1f8.plane.zaxis);
        ON_3dPoint::operator+((ON_3dPoint *)&local_288,(ON_3dPoint *)&local_1f8,&local_348);
        local_1f8.plane.origin.z = local_288.plane.origin.z;
        local_1f8.plane.origin.x = local_288.plane.origin.x;
        local_1f8.plane.origin.y = local_288.plane.origin.y;
        ON_Plane::UpdateEquation(&local_1f8.plane);
        local_1f8.major_radius =
             ON_3dPoint::DistanceTo((ON_3dPoint *)&local_1f8,(ON_3dPoint *)&local_160);
        local_1f8.minor_radius = local_160.radius;
        ON_Torus::ON_Torus(&local_288);
        pOVar13 = &local_160;
        pOVar14 = &local_288;
        for (lVar10 = 0x10; lVar10 != 0; lVar10 = lVar10 + -1) {
          (pOVar14->plane).origin.x = (pOVar13->plane).origin.x;
          pOVar13 = (ON_Circle *)((long)pOVar13 + ((ulong)bVar15 * -2 + 1) * 8);
          pOVar14 = (ON_Torus *)((long)pOVar14 + ((ulong)bVar15 * -2 + 1) * 8);
        }
        P_01.y = local_c8.plane.origin.y;
        P_01.x = local_c8.plane.origin.x;
        P_01.z = local_c8.plane.origin.z;
        dVar16 = ON_PlaneEquation::ValueAt(&local_288.plane.plane_equation,P_01);
        ::operator*(&local_2f8,dVar16,&local_288.plane.zaxis);
        ON_3dPoint::operator+((ON_3dPoint *)&local_348,(ON_3dPoint *)&local_288,&local_2f8);
        local_288.plane.origin.z = local_348.z;
        local_288.plane.origin.x = local_348.x;
        local_288.plane.origin.y = local_348.y;
        ON_Plane::UpdateEquation(&local_288.plane);
        local_288.major_radius =
             ON_3dPoint::DistanceTo((ON_3dPoint *)&local_288,(ON_3dPoint *)&local_c8);
        local_288.minor_radius = local_c8.radius;
        bVar4 = ON_Torus::IsValid(&local_1f8,(ON_TextLog *)0x0);
        bVar5 = ON_Torus::IsValid(&local_288,(ON_TextLog *)0x0);
        if (bVar4 || bVar5) {
          local_308 = local_308 * 7.450580596925e-09;
          dVar16 = 0.0;
          local_330 = 0.0;
          local_328 = 0.0;
          do {
            local_2c0 = (dVar16 + dVar16) * 3.141592653589793;
            local_2c8 = dVar16;
            ON_Circle::PointAt(&local_320,&local_c8,local_2c0);
            local_348.z = local_320.z;
            local_348.x = local_320.x;
            local_348.y = local_320.y;
            if (bVar4 != false) {
              test_point.y = local_320.y;
              test_point.x = local_320.x;
              test_point.z = local_320.z;
              ON_Torus::ClosestPointTo(&local_320,&local_1f8,test_point);
              local_2f8.z = local_320.z;
              local_2f8.x = local_320.x;
              local_2f8.y = local_320.y;
              dVar16 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_2f8,(ON_3dPoint *)&local_348);
              if (dVar16 <= local_308) {
                if (local_328 < dVar16) {
                  local_328 = dVar16;
                }
              }
              else {
                bVar4 = false;
                bVar2 = false;
                if (bVar5 == false) goto LAB_005a397b;
              }
            }
            if (bVar5 != false) {
              test_point_00.y = local_348.y;
              test_point_00.x = local_348.x;
              test_point_00.z = local_348.z;
              ON_Torus::ClosestPointTo(&local_320,&local_288,test_point_00);
              local_2f8.z = local_320.z;
              local_2f8.x = local_320.x;
              local_2f8.y = local_320.y;
              dVar16 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_2f8,(ON_3dPoint *)&local_348);
              if (dVar16 <= local_308) {
                if (local_330 < dVar16) {
                  local_330 = dVar16;
                }
              }
              else {
                bVar5 = false;
                bVar2 = false;
                if (bVar4 == false) goto LAB_005a397b;
              }
            }
            ON_Circle::PointAt(&local_320,&local_160,local_2c0);
            local_348.z = local_320.z;
            local_348.x = local_320.x;
            local_348.y = local_320.y;
            if (bVar4 != false) {
              test_point_01.y = local_320.y;
              test_point_01.x = local_320.x;
              test_point_01.z = local_320.z;
              ON_Torus::ClosestPointTo(&local_320,&local_1f8,test_point_01);
              local_2f8.z = local_320.z;
              local_2f8.x = local_320.x;
              local_2f8.y = local_320.y;
              dVar16 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_2f8,(ON_3dPoint *)&local_348);
              if (dVar16 <= local_308) {
                if (local_328 < dVar16) {
                  local_328 = dVar16;
                }
              }
              else {
                bVar4 = false;
                bVar2 = false;
                if (bVar5 == false) goto LAB_005a397b;
              }
            }
            if (bVar5 != false) {
              test_point_02.y = local_348.y;
              test_point_02.x = local_348.x;
              test_point_02.z = local_348.z;
              ON_Torus::ClosestPointTo(&local_320,&local_288,test_point_02);
              local_2f8.z = local_320.z;
              local_2f8.x = local_320.x;
              local_2f8.y = local_320.y;
              dVar16 = ON_3dPoint::DistanceTo((ON_3dPoint *)&local_2f8,(ON_3dPoint *)&local_348);
              if (dVar16 <= local_308) {
                if (local_330 < dVar16) {
                  local_330 = dVar16;
                }
              }
              else {
                bVar5 = false;
                bVar2 = false;
                if (bVar4 == false) goto LAB_005a397b;
              }
            }
            dVar16 = local_2c8 + 0.25;
          } while (dVar16 < 1.0);
          if ((bVar4 == false) && (bVar5 == false)) goto LAB_005a3979;
          uVar7 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,0);
          uVar8 = (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x28])(this,1);
          memblock = onmalloc((long)(int)(uVar7 + uVar8 + 2) << 3);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,0,memblock);
          local_2c0 = (double)((long)(int)uVar7 * 8 + 8 + (long)memblock);
          (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x29])(this,1);
          if (0 < (int)uVar7) {
            if (local_2d8._0_8_ <= local_308) {
              local_2d8._0_4_ = SUB84(local_308,0);
              local_2d8._4_4_ = (undefined4)((ulong)local_308 >> 0x20);
            }
            local_2a0 = (ulong)uVar7;
            uVar11 = 0;
            local_2c8 = (double)(ulong)uVar8;
            local_2b0 = memblock;
            local_298 = (double)(ulong)uVar8;
            do {
              uVar7 = (uint)(uVar11 != 0);
              local_290 = uVar11;
              do {
                local_308 = ((double)(int)(4 - uVar7) * *(double *)((long)local_2b0 + local_290 * 8)
                            + (double)(int)uVar7 * *(double *)((long)local_2b0 + local_290 * 8 + 8))
                            * 0.25;
                local_2b4 = uVar7;
                if (0 < SUB84(local_298,0)) {
                  dVar16 = 0.0;
                  do {
                    uVar7 = (uint)(dVar16 != 0.0);
                    iVar6 = 4 - (uint)(dVar16 != 0.0);
                    do {
                      PointAt(&local_320,this,local_308,
                              ((double)iVar6 * *(double *)((long)local_2c0 + (long)dVar16 * 8) +
                              (double)(int)uVar7 *
                              *(double *)((long)local_2c0 + 8 + (long)dVar16 * 8)) * 0.25);
                      local_348.z = local_320.z;
                      local_348.x = local_320.x;
                      local_348.y = local_320.y;
                      if (bVar4 != false) {
                        test_point_03.y = local_320.y;
                        test_point_03.x = local_320.x;
                        test_point_03.z = local_320.z;
                        ON_Torus::ClosestPointTo(&local_320,&local_1f8,test_point_03);
                        local_2f8.z = local_320.z;
                        local_2f8.x = local_320.x;
                        local_2f8.y = local_320.y;
                        dVar1 = ON_3dPoint::DistanceTo
                                          ((ON_3dPoint *)&local_2f8,(ON_3dPoint *)&local_348);
                        if (dVar1 <= (double)local_2d8._0_8_) {
                          if (local_328 < dVar1) {
                            local_328 = dVar1;
                          }
                          goto LAB_005a3829;
                        }
                        if (bVar5 != false) {
                          bVar4 = false;
                          goto LAB_005a3829;
                        }
LAB_005a396c:
                        onfree(local_2b0);
                        goto LAB_005a3979;
                      }
LAB_005a3829:
                      if (bVar5 != false) {
                        test_point_04.y = local_348.y;
                        test_point_04.x = local_348.x;
                        test_point_04.z = local_348.z;
                        ON_Torus::ClosestPointTo(&local_320,&local_288,test_point_04);
                        local_2f8.z = local_320.z;
                        local_2f8.x = local_320.x;
                        local_2f8.y = local_320.y;
                        dVar1 = ON_3dPoint::DistanceTo
                                          ((ON_3dPoint *)&local_2f8,(ON_3dPoint *)&local_348);
                        if (dVar1 <= (double)local_2d8._0_8_) {
                          if (local_330 < dVar1) {
                            local_330 = dVar1;
                          }
                        }
                        else {
                          if (bVar4 == false) goto LAB_005a396c;
                          bVar5 = false;
                        }
                      }
                      uVar7 = uVar7 + 1;
                      iVar6 = iVar6 + -1;
                    } while (uVar7 != 5);
                    dVar16 = (double)((long)dVar16 + 1);
                  } while (dVar16 != local_2c8);
                }
                uVar7 = local_2b4 + 1;
              } while (uVar7 != 5);
              uVar11 = local_290 + 1;
              memblock = local_2b0;
            } while (uVar11 != local_2a0);
          }
          onfree(memblock);
          bVar2 = (bool)(bVar4 | bVar5);
          if ((local_2a8 != (ON_Torus *)0x0) && (bVar2 != false)) {
            pOVar14 = &local_1f8;
            if (local_330 < local_328) {
              pOVar14 = &local_288;
            }
            if (bVar5 == false) {
              pOVar14 = &local_1f8;
            }
            if (bVar4 == false) {
              pOVar14 = &local_288;
            }
            memcpy(local_2a8,pOVar14,0x90);
            bVar2 = true;
          }
        }
        else {
LAB_005a3979:
          bVar2 = false;
        }
LAB_005a397b:
        ON_Torus::~ON_Torus(&local_288);
        ON_Torus::~ON_Torus(&local_1f8);
      }
      ON_Plane::~ON_Plane(&local_160.plane);
      goto LAB_005a39a2;
    }
  }
  bVar2 = false;
LAB_005a39a2:
  ON_Plane::~ON_Plane(&local_c8.plane);
  return bVar2;
}

Assistant:

bool ON_Surface::IsTorus( ON_Torus* torus, double tolerance ) const
{
  if ( !ON_IsValid(tolerance) || tolerance <= 0.0 )
    tolerance = ON_ZERO_TOLERANCE;

  ON_Curve* crv = IsoCurve(0,Domain(1).Mid());
  if ( !crv )
    return false;

  ON_Arc arc0;
  int bIsArc0 = crv->IsArc(0,&arc0,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc0 )
    return false;

  crv = IsoCurve(1,Domain(0).Mid());
  if ( !crv )
    return false;
  ON_Arc arc1;
  int bIsArc1 = crv->IsArc(0,&arc1,tolerance > ON_ZERO_TOLERANCE ? tolerance : 0.0);
  delete crv;
  crv = 0;
  if ( !bIsArc1 )
    return false;

  double tol = 0.5*ON_SQRT_EPSILON*(arc0.radius+arc1.radius);

  ON_Torus tr0;
  tr0.plane = arc0.plane;
  double h = tr0.plane.plane_equation.ValueAt(arc1.plane.origin);
  tr0.plane.origin = tr0.plane.origin + h*tr0.plane.zaxis;
  tr0.plane.UpdateEquation();
  tr0.major_radius = tr0.plane.origin.DistanceTo(arc1.plane.origin);
  tr0.minor_radius = arc1.radius;

  ON_Torus tr1;
  tr1.plane = arc1.plane;
  h = tr1.plane.plane_equation.ValueAt(arc0.plane.origin);
  tr1.plane.origin = tr1.plane.origin + h*tr1.plane.zaxis;
  tr1.plane.UpdateEquation();
  tr1.major_radius = tr1.plane.origin.DistanceTo(arc0.plane.origin);
  tr1.minor_radius = arc0.radius;

  bool bTestTorus0 = tr0.IsValid()?true:false;
  bool bTestTorus1 = tr1.IsValid()?true:false;
  if ( !bTestTorus0 && !bTestTorus1 )
    return false;
  double tr0tol = 0.0;
  double tr1tol = 0.0;

  ON_3dPoint P, T;
  double a, d;
  for ( a = 0.0; a < 1.0; a += 0.25 )
  {
    P = arc0.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }

    P = arc1.PointAt(a*2.0*ON_PI);
    if ( bTestTorus0 )
    {
      T = tr0.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus0 = false;
        if ( !bTestTorus1 )
          return false;
      }
      else if ( d > tr0tol )
        tr0tol = d;
    }
    if ( bTestTorus1 )
    {
      T = tr1.ClosestPointTo(P);
      d = T.DistanceTo(P);
      if ( d > tol )
      {
        bTestTorus1 = false;
        if ( !bTestTorus0 )
          return false;
      }
      else if ( d > tr1tol )
        tr1tol = d;
    }
  }
  // If the arc's planes are perpendicular, then
  // both will be true unless we have a bug or
  // numerical issues.
  if (!bTestTorus0 && !bTestTorus1)
    return false;

  if ( tol < tolerance )
    tol = tolerance;

  double u, v;
  int sc0 = SpanCount(0);
  int sc1 = SpanCount(1);
  double* s = (double*)onmalloc( (sc0+sc1+2)*sizeof(s[0]) );
  double* t = s + (sc0+1);
  GetSpanVector(0,s);
  GetSpanVector(1,t);
  for ( int i = 0; i < sc0; i++ )
  {
    for ( int ii = i?1:0; ii <= 4; ii++ )
    {
      u = 0.25*((4-ii)*s[i] + ii*s[i+1]);
      for ( int j = 0; j < sc1; j++ )
      {
        for ( int jj = j?1:0; jj <= 4; jj++ )
        {
          v = 0.25*((4-jj)*t[j] + jj*t[j+1]);
          P = PointAt(u,v);
          if ( bTestTorus0 )
          {
            T = tr0.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus0 = false;
              if ( !bTestTorus1 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr0tol )
              tr0tol = d;
          }
          if ( bTestTorus1 )
          {
            T = tr1.ClosestPointTo(P);
            d = T.DistanceTo(P);
            if ( d > tol )
            {
              bTestTorus1 = false;
              if ( !bTestTorus0 )
              {
                onfree(s);
                return false;
              }
            }
            else if ( d > tr1tol )
              tr1tol = d;
          }
        }
      }
    }
  }
  onfree(s);

  bool rc = (bTestTorus0 || bTestTorus1);
  if ( rc && torus )
  {
    if (!bTestTorus0)
      *torus = tr1;
    else if (!bTestTorus1)
      *torus = tr0;
    else if (tr0tol <= tr1tol)
      *torus = tr0;
    else
      *torus = tr1;
  }

  return rc;
}